

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_abi_cxx11_
          (CompilerGLSL *this,uint32_t base,uint32_t *indices,uint32_t count,SPIRType *target_type,
          uint32_t offset,uint32_t matrix_stride,uint32_t param_7,bool need_transpose)

{
  bool bVar1;
  CompilerError *this_00;
  uint32_t count_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  uint32_t offset_00;
  undefined4 in_register_0000008c;
  byte in_stack_00000020;
  allocator local_61;
  string local_60 [39];
  byte local_39;
  long lStack_38;
  bool need_transpose_local;
  SPIRType *target_type_local;
  undefined8 uStack_28;
  uint32_t count_local;
  uint32_t *indices_local;
  undefined8 uStack_18;
  uint32_t base_local;
  CompilerGLSL *this_local;
  
  lStack_38 = CONCAT44(in_register_0000008c,offset);
  uStack_18 = CONCAT44(in_register_00000034,base);
  uStack_28 = CONCAT44(in_register_0000000c,count);
  indices_local._4_4_ = (uint)indices;
  target_type_local._4_4_ = (uint)target_type;
  local_39 = in_stack_00000020 & 1;
  this_local = this;
  bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(lStack_38 + 0x20));
  if (!bVar1) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_60,"Access chains that result in an array can not be flattened",&local_61);
    CompilerError::CompilerError(this_00,(string *)local_60);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  count_00 = (uint32_t)uStack_28;
  offset_00 = (uint32_t)lStack_38;
  if (*(int *)(lStack_38 + 0xc) == 0xf) {
    flattened_access_chain_struct_abi_cxx11_
              (this,base,(uint32_t *)(ulong)indices_local._4_4_,count_00,
               (SPIRType *)(ulong)target_type_local._4_4_,offset_00);
  }
  else if (*(uint *)(lStack_38 + 0x18) < 2) {
    flattened_access_chain_vector_abi_cxx11_
              (this,base,(uint32_t *)(ulong)indices_local._4_4_,count_00,
               (SPIRType *)(ulong)target_type_local._4_4_,offset_00,matrix_stride,SUB41(param_7,0));
  }
  else {
    flattened_access_chain_matrix_abi_cxx11_
              (this,base,(uint32_t *)(ulong)indices_local._4_4_,count_00,
               (SPIRType *)(ulong)target_type_local._4_4_,offset_00,matrix_stride,SUB41(param_7,0));
  }
  return this;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain(uint32_t base, const uint32_t *indices, uint32_t count,
                                                 const SPIRType &target_type, uint32_t offset, uint32_t matrix_stride,
                                                 uint32_t /* array_stride */, bool need_transpose)
{
	if (!target_type.array.empty())
		SPIRV_CROSS_THROW("Access chains that result in an array can not be flattened");
	else if (target_type.basetype == SPIRType::Struct)
		return flattened_access_chain_struct(base, indices, count, target_type, offset);
	else if (target_type.columns > 1)
		return flattened_access_chain_matrix(base, indices, count, target_type, offset, matrix_stride, need_transpose);
	else
		return flattened_access_chain_vector(base, indices, count, target_type, offset, matrix_stride, need_transpose);
}